

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal.hpp
# Opt level: O0

void tao::pegtl::normal<ovf::detail::parse::v2::keyword_value_line>::
     raise<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,ovf_file&,ovf_segment_const&,double*&>
               (memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *in,ovf_file *param_2,ovf_segment *param_3,double **param_4)

{
  parse_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  double **local_28;
  double **param_3_local;
  ovf_segment *param_2_local;
  ovf_file *param_1_local;
  memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_local;
  
  local_28 = param_4;
  param_3_local = (double **)param_3;
  param_2_local = (ovf_segment *)param_2;
  param_1_local = (ovf_file *)in;
  this = (parse_error *)__cxa_allocate_exception(0x28);
  internal::demangle<ovf::detail::parse::v2::keyword_value_line>();
  std::operator+(&local_48,"parse error matching ",&local_68);
  parse_error::
  parse_error<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>
            (this,&local_48,
             (memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)param_1_local);
  __cxa_throw(this,&parse_error::typeinfo,parse_error::~parse_error);
}

Assistant:

static void raise( const Input& in, States&&... /*unused*/ )
         {
            throw parse_error( "parse error matching " + internal::demangle< Rule >(), in );
         }